

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split_internal.h
# Opt level: O3

SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
absl::lts_20240722::strings_internal::
SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
::operator++(SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *this)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  
  while( true ) {
    if (this->state_ == kLastState) {
      this->state_ = kEndState;
      return this;
    }
    uVar1 = (this->splitter_->text_)._M_len;
    pcVar2 = (this->splitter_->text_)._M_str;
    auVar5 = absl::lts_20240722::ByChar::Find(&this->delimiter_,uVar1,pcVar2,this->pos_);
    if (auVar5._8_8_ == pcVar2 + uVar1) {
      this->state_ = kLastState;
    }
    uVar3 = this->pos_;
    if (uVar1 < uVar3) break;
    uVar4 = (long)auVar5._8_8_ - (long)(pcVar2 + uVar3);
    if (uVar1 - uVar3 < uVar4) {
      uVar4 = uVar1 - uVar3;
    }
    (this->curr_)._M_len = uVar4;
    (this->curr_)._M_str = pcVar2 + uVar3;
    this->pos_ = auVar5._0_8_ + uVar3 + uVar4;
    if (uVar4 != 0) {
      return this;
    }
  }
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",uVar3,
             uVar1);
}

Assistant:

SplitIterator& operator++() {
    do {
      if (state_ == kLastState) {
        state_ = kEndState;
        return *this;
      }
      const absl::string_view text = splitter_->text();
      const absl::string_view d = delimiter_.Find(text, pos_);
      if (d.data() == text.data() + text.size()) state_ = kLastState;
      curr_ = text.substr(pos_,
                          static_cast<size_t>(d.data() - (text.data() + pos_)));
      pos_ += curr_.size() + d.size();
    } while (!predicate_(curr_));
    return *this;
  }